

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

optional<bool>
anon_unknown.dwarf_127a599::AdjustRPathELF
          (string *file,EmptyCallback *emptyCallback,AdjustCallback *adjustCallback,string *emsg,
          bool *changed)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  StringEntry *pSVar7;
  long *plVar8;
  undefined1 *puVar9;
  ulong uVar10;
  uint uVar11;
  ushort uVar12;
  ulong uVar13;
  long lVar14;
  ushort uVar15;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmELF elf;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  outRPath;
  StringEntry *se [2];
  char *se_name [2];
  ofstream f;
  cmSystemToolsRPathInfo rp [2];
  undefined1 local_390 [40];
  string *local_368;
  undefined1 local_360 [32];
  bool local_340 [8];
  StringEntry *local_338 [2];
  char *local_328 [3];
  long local_310;
  ulong local_308;
  ulong local_300;
  undefined1 local_2f8 [32];
  undefined1 local_2d8 [8];
  char *local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c8;
  size_t local_2c0;
  StringEntry *local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  char *local_2a0;
  undefined8 local_298;
  ios_base local_1e0 [264];
  size_type local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  string local_a8 [8];
  ulong local_a0 [11];
  long local_48 [3];
  
  if (changed != (bool *)0x0) {
    *changed = false;
  }
  lVar6 = 0xa0;
  puVar9 = local_c8 + 0x10;
  do {
    *(undefined1 **)(puVar9 + -0x10) = puVar9;
    *(undefined8 *)(puVar9 + -8) = 0;
    *puVar9 = 0;
    *(undefined1 **)(puVar9 + 0x10) = puVar9 + 0x20;
    *(undefined8 *)(puVar9 + 0x18) = 0;
    puVar9[0x20] = 0;
    puVar9 = puVar9 + 0x50;
    lVar6 = lVar6 + -0x50;
  } while (lVar6 != 0);
  local_368 = file;
  cmELF::cmELF((cmELF *)local_390,(file->_M_dataplus)._M_p);
  bVar3 = cmELF::Valid((cmELF *)local_390);
  if (bVar3) {
    local_338[0] = (StringEntry *)0x0;
    local_338[1] = (StringEntry *)0x0;
    local_328[0] = (char *)0x0;
    local_328[1] = (char *)0x0;
    pSVar7 = cmELF::GetRPath((cmELF *)local_390);
    if (pSVar7 != (StringEntry *)0x0) {
      local_328[0] = "RPATH";
      local_338[0] = pSVar7;
    }
    uVar11 = (uint)(pSVar7 != (StringEntry *)0x0);
    pSVar7 = cmELF::GetRunPath((cmELF *)local_390);
    if (pSVar7 != (StringEntry *)0x0) {
      *(StringEntry **)((long)local_338 + (ulong)(uVar11 * 8)) = pSVar7;
      *(char **)((long)local_338 + (ulong)(uVar11 * 8) + 0x10) = "RUNPATH";
      uVar11 = uVar11 + 1;
    }
    if (uVar11 == 0) {
      local_2d8 = (undefined1  [8])emsg;
      if ((emptyCallback->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      bVar3 = (*emptyCallback->_M_invoker)
                        ((_Any_data *)emptyCallback,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                         local_2d8,(cmELF *)local_390);
      uVar15 = (ushort)bVar3;
      bVar3 = false;
      bVar4 = true;
      uVar11 = 0;
    }
    else {
      bVar3 = uVar11 == 0;
      if (uVar11 == 0) {
        bVar4 = true;
        uVar11 = 0;
      }
      else {
        local_308 = (ulong)uVar11;
        local_310 = -(ulong)uVar11;
        bVar4 = true;
        uVar10 = 1;
        uVar11 = 0;
        do {
          if ((uVar11 == 0) ||
             (uVar13 = uVar10,
             local_d8[0] != *(size_type *)(*(long *)(local_340 + uVar10 * 8) + 0x20))) {
            pbVar1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (local_340 + uVar10 * 8);
            lVar6 = (long)(int)uVar11;
            lVar14 = lVar6 * 0x50;
            local_d8[lVar6 * 10] = (size_type)pbVar1[1]._M_dataplus._M_p;
            local_d8[lVar6 * 10 + 1] = pbVar1[1]._M_string_length;
            local_300 = uVar10;
            pSVar7 = local_338[uVar10 + 1];
            pcVar2 = *(char **)(local_a8 + lVar14 + -0x18);
            strlen((char *)pSVar7);
            std::__cxx11::string::_M_replace((ulong)(local_c8 + lVar14),0,pcVar2,(ulong)pSVar7);
            local_340[0] = false;
            local_2f8._0_8_ = emsg;
            local_2d8 = (undefined1  [8])pSVar7;
            if ((adjustCallback->super__Function_base)._M_manager == (_Manager_type)0x0) {
              std::__throw_bad_function_call();
            }
            bVar5 = (*adjustCallback->_M_invoker)
                              ((_Any_data *)adjustCallback,
                               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                     *)local_360)->_M_value,pbVar1,(char **)local_2d8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **
                               )local_2f8);
            if (bVar5) {
              bVar5 = true;
              if (local_340[0] == true) {
                if (local_360._8_8_ != 0) {
                  bVar4 = false;
                }
                if (local_d8[lVar6 * 10 + 1] < local_360._8_8_ + 1) {
                  if (emsg == (string *)0x0) goto LAB_003d2c54;
                  local_2d8 = (undefined1  [8])0x29;
                  local_2d0 = "The replacement path is too long for the ";
                  local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0;
                  local_2c0 = strlen((char *)pSVar7);
                  local_2b0 = 0;
                  local_2a8 = 7;
                  local_2a0 = " entry.";
                  local_298 = 0;
                  views._M_len = 3;
                  views._M_array = (iterator)local_2d8;
                  local_2b8 = pSVar7;
                  cmCatViews((string *)local_2f8,views);
                  std::__cxx11::string::operator=((string *)emsg,(string *)local_2f8);
                  if ((string *)local_2f8._0_8_ != (string *)(local_2f8 + 0x10)) {
                    operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
                  }
                  bVar5 = false;
                }
                else {
                  std::__cxx11::string::operator=
                            (local_a8 + lVar14,
                             (string *)
                             &((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                *)local_360)->_M_value);
                  uVar11 = uVar11 + 1;
                }
              }
              else {
                bVar4 = false;
              }
            }
            else {
LAB_003d2c54:
              bVar5 = false;
            }
            if ((local_340[0] == true) &&
               (local_340[0] = false,
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_360._0_8_ !=
               &(((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                   *)local_360)->_M_value).field_2)) {
              operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
            }
            uVar13 = local_300;
            if (!bVar5) break;
          }
          bVar3 = local_308 <= uVar13;
          uVar10 = uVar13 + 1;
        } while (local_310 + uVar13 != 0);
      }
      uVar15 = 0;
    }
    uVar12 = 0x100;
  }
  else {
    uVar15 = 0;
    bVar4 = true;
    uVar12 = 0;
    bVar3 = false;
    uVar11 = 0;
  }
  cmELF::~cmELF((cmELF *)local_390);
  if (bVar3) {
    uVar12 = 0x100;
    uVar15 = 1;
    if (uVar11 != 0) {
      if (bVar4) {
        bVar3 = cmSystemTools::RemoveRPath(local_368,emsg,changed);
        uVar15 = (ushort)bVar3;
      }
      else {
        std::ofstream::ofstream(local_2d8,(local_368->_M_dataplus)._M_p,_S_out|_S_in|_S_bin);
        if ((*(byte *)((long)&local_2b8 + ((StringEntry *)((long)local_2d8 + -0x38))->Position) & 5)
            == 0) {
          if (0 < (int)uVar11) {
            uVar10 = 0;
            do {
              lVar6 = uVar10 * 0x50;
              plVar8 = (long *)std::ostream::seekp((ostream *)local_2d8,local_d8[uVar10 * 10],0);
              if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0) {
                if (emsg != (string *)0x0) {
                  cmStrCat<char_const(&)[18],std::__cxx11::string&,char_const(&)[11]>
                            ((string *)local_390,(char (*) [18])"Error seeking to ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_c8 + lVar6),(char (*) [11])0x9453d8);
LAB_003d2f6f:
                  std::__cxx11::string::operator=((string *)emsg,(string *)local_390);
                  if ((undefined1 *)CONCAT71(local_390._1_7_,local_390[0]) != local_390 + 0x10) {
                    operator_delete((undefined1 *)CONCAT71(local_390._1_7_,local_390[0]),
                                    local_390._16_8_ + 1);
                  }
                }
LAB_003d2f99:
                local_2d8 = (undefined1  [8])_VTT;
                *(undefined8 *)(local_2d8 + _VTT[-1].Position) = _EVP_PKEY_get_bn_param;
                std::filebuf::~filebuf((filebuf *)&local_2d0);
                std::ios_base::~ios_base(local_1e0);
                uVar15 = 0;
                goto LAB_003d2fd4;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2d8,*(char **)(local_a8 + lVar6),local_a0[uVar10 * 10]);
              for (uVar13 = local_a0[uVar10 * 10]; uVar13 < local_d8[uVar10 * 10 + 1];
                  uVar13 = uVar13 + 1) {
                local_390[0] = (string)0x0;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,local_390,1)
                ;
              }
              if ((*(byte *)((long)&local_2b8 + ((StringEntry *)((long)local_2d8 + -0x38))->Position
                            ) & 5) != 0) {
                if (emsg != (string *)0x0) {
                  cmStrCat<char_const(&)[23],std::__cxx11::string&,char_const(&)[21]>
                            ((string *)local_390,(char (*) [23])"Error writing the new ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_c8 + lVar6),(char (*) [21])0x945400);
                  goto LAB_003d2f6f;
                }
                goto LAB_003d2f99;
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 != uVar11);
          }
          local_2d8 = (undefined1  [8])_VTT;
          *(undefined8 *)(local_2d8 + _VTT[-1].Position) = _EVP_PKEY_get_bn_param;
          std::filebuf::~filebuf((filebuf *)&local_2d0);
          std::ios_base::~ios_base(local_1e0);
          uVar15 = 1;
          if (changed != (bool *)0x0) {
            *changed = true;
          }
LAB_003d2fd4:
          uVar12 = 0x100;
        }
        else {
          if (emsg != (string *)0x0) {
            std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,0x945280);
          }
          local_2d8 = (undefined1  [8])_VTT;
          *(undefined8 *)(local_2d8 + _VTT[-1].Position) = _EVP_PKEY_get_bn_param;
          std::filebuf::~filebuf((filebuf *)&local_2d0);
          std::ios_base::~ios_base(local_1e0);
          uVar15 = 0;
        }
      }
    }
  }
  lVar6 = -0xa0;
  plVar8 = local_48;
  do {
    if (plVar8 != (long *)plVar8[-2]) {
      operator_delete((long *)plVar8[-2],*plVar8 + 1);
    }
    if (plVar8 + -4 != (long *)plVar8[-6]) {
      operator_delete((long *)plVar8[-6],plVar8[-4] + 1);
    }
    plVar8 = plVar8 + -10;
    lVar6 = lVar6 + 0x50;
  } while (lVar6 != 0);
  return (_Optional_base<bool,_true,_true>)(_Optional_base<bool,_true,_true>)(uVar15 | uVar12);
}

Assistant:

cm::optional<bool> AdjustRPathELF(std::string const& file,
                                  const EmptyCallback& emptyCallback,
                                  const AdjustCallback& adjustCallback,
                                  std::string* emsg, bool* changed)
{
  if (changed) {
    *changed = false;
  }
  int rp_count = 0;
  bool remove_rpath = true;
  cmSystemToolsRPathInfo rp[2];
  {
    // Parse the ELF binary.
    cmELF elf(file.c_str());
    if (!elf) {
      return cm::nullopt; // Not a valid ELF file.
    }

    // Get the RPATH and RUNPATH entries from it.
    int se_count = 0;
    cmELF::StringEntry const* se[2] = { nullptr, nullptr };
    const char* se_name[2] = { nullptr, nullptr };
    if (cmELF::StringEntry const* se_rpath = elf.GetRPath()) {
      se[se_count] = se_rpath;
      se_name[se_count] = "RPATH";
      ++se_count;
    }
    if (cmELF::StringEntry const* se_runpath = elf.GetRunPath()) {
      se[se_count] = se_runpath;
      se_name[se_count] = "RUNPATH";
      ++se_count;
    }
    if (se_count == 0) {
      return emptyCallback(emsg, elf);
    }

    for (int i = 0; i < se_count; ++i) {
      // If both RPATH and RUNPATH refer to the same string literal it
      // needs to be changed only once.
      if (rp_count && rp[0].Position == se[i]->Position) {
        continue;
      }

      // Store information about the entry in the file.
      rp[rp_count].Position = se[i]->Position;
      rp[rp_count].Size = se[i]->Size;
      rp[rp_count].Name = se_name[i];

      // Adjust the rpath.
      cm::optional<std::string> outRPath;
      if (!adjustCallback(outRPath, se[i]->Value, se_name[i], emsg)) {
        return false;
      }

      if (outRPath) {
        if (!outRPath->empty()) {
          remove_rpath = false;
        }

        // Make sure there is enough room to store the new rpath and at
        // least one null terminator.
        if (rp[rp_count].Size < outRPath->length() + 1) {
          if (emsg) {
            *emsg = cmStrCat("The replacement path is too long for the ",
                             se_name[i], " entry.");
          }
          return false;
        }

        // This entry is ready for update.
        rp[rp_count].Value = std::move(*outRPath);
        ++rp_count;
      } else {
        remove_rpath = false;
      }
    }
  }

  // If no runtime path needs to be changed, we are done.
  if (rp_count == 0) {
    return true;
  }

  // If the resulting rpath is empty, just remove the entire entry instead.
  if (remove_rpath) {
    return cmSystemTools::RemoveRPath(file, emsg, changed);
  }

  {
    // Open the file for update.
    cmsys::ofstream f(file.c_str(),
                      std::ios::in | std::ios::out | std::ios::binary);
    if (!f) {
      if (emsg) {
        *emsg = "Error opening file for update.";
      }
      return false;
    }

    // Store the new RPATH and RUNPATH strings.
    for (int i = 0; i < rp_count; ++i) {
      // Seek to the RPATH position.
      if (!f.seekp(rp[i].Position)) {
        if (emsg) {
          *emsg = cmStrCat("Error seeking to ", rp[i].Name, " position.");
        }
        return false;
      }

      // Write the new rpath.  Follow it with enough null terminators to
      // fill the string table entry.
      f << rp[i].Value;
      for (unsigned long j = rp[i].Value.length(); j < rp[i].Size; ++j) {
        f << '\0';
      }

      // Make sure it wrote correctly.
      if (!f) {
        if (emsg) {
          *emsg = cmStrCat("Error writing the new ", rp[i].Name,
                           " string to the file.");
        }
        return false;
      }
    }
  }

  // Everything was updated successfully.
  if (changed) {
    *changed = true;
  }
  return true;
}